

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

void Cmd_gl_resetmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  byte bVar1;
  
  glset.lightmode = (SBYTE)gl_lightmode.Value;
  if (((byte)glset.map_lightmode < 9) && ((0x11fU >> ((byte)glset.map_lightmode & 0x1f) & 1) != 0))
  {
    glset.lightmode = (&DAT_00721a79)[(uint)(byte)glset.map_lightmode];
  }
  bVar1 = glset.map_nocoloredspritelighting != '\0';
  if (glset.map_nocoloredspritelighting == -1) {
    bVar1 = gl_nocoloredspritelighting.Value;
  }
  glset.nocoloredspritelighting = (bool)(bVar1 & 1);
  bVar1 = glset.map_notexturefill != '\0';
  if (glset.map_notexturefill == -1) {
    bVar1 = gl_notexturefill.Value;
  }
  glset.notexturefill = (bool)(bVar1 & 1);
  bVar1 = glset.map_brightfog != '\0';
  if (glset.map_brightfog == -1) {
    bVar1 = gl_brightfog.Value;
  }
  glset.brightfog = (bool)(bVar1 & 1);
  return;
}

Assistant:

bool IsLightmodeValid()
{
	return (glset.map_lightmode >= 0 && glset.map_lightmode <= 4) || glset.map_lightmode == 8;
}